

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

double b2d(Bigint *a,int *e)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  byte bVar4;
  uint32 x;
  uint uVar5;
  uint32 uVar6;
  uint32 *puVar7;
  
  iVar1 = a->wds;
  puVar7 = a->x + (long)iVar1 + -1;
  x = *puVar7;
  uVar3 = hi0bits(x);
  *e = 0x20 - uVar3;
  cVar2 = (char)uVar3;
  if (uVar3 < 0xb) {
    uVar3 = 0;
    if (a->x < puVar7) {
      uVar3 = a->x[(long)iVar1 + -2];
    }
    uVar5 = uVar3 >> (0xbU - cVar2 & 0x1f) | x << (cVar2 + 0x15U & 0x1f);
    x = x >> (0xbU - cVar2 & 0x1f);
  }
  else {
    uVar5 = 0;
    if (1 < iVar1) {
      uVar5 = a->x[(long)iVar1 + -2];
      puVar7 = a->x + (long)iVar1 + -2;
    }
    if (uVar3 - 0xb != 0) {
      bVar4 = (byte)(uVar3 - 0xb);
      uVar6 = 0;
      if (a->x < puVar7) {
        uVar6 = puVar7[-1];
      }
      x = x << (bVar4 & 0x1f) | uVar5 >> (0x2bU - cVar2 & 0x1f);
      uVar5 = uVar5 << (bVar4 & 0x1f) | uVar6 >> (0x2bU - cVar2 & 0x1f);
    }
  }
  return (double)(CONCAT44(x,uVar5) | 0x3ff0000000000000);
}

Assistant:

static double
b2d(Bigint *a, int *e)
{
    ULong *xa, *xa0, w, y, z;
    int k;
    U d;

    xa0 = a->x;
    xa = xa0 + a->wds;
    y = *--xa;
#ifdef DEBUG
    if (!y) Bug("zero y in b2d");
#endif
    k = hi0bits(y);
    *e = 32 - k;
    if (k < Ebits) {
        word0(&d) = Exp_1 | y >> (Ebits - k);
        w = xa > xa0 ? *--xa : 0;
        word1(&d) = y << ((32-Ebits) + k) | w >> (Ebits - k);
        goto ret_d;
    }
    z = xa > xa0 ? *--xa : 0;
    if (k -= Ebits) {
        word0(&d) = Exp_1 | y << k | z >> (32 - k);
        y = xa > xa0 ? *--xa : 0;
        word1(&d) = z << k | y >> (32 - k);
    }
    else {
        word0(&d) = Exp_1 | y;
        word1(&d) = z;
    }
  ret_d:
    return dval(&d);
}